

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O0

bool __thiscall cmFindBase::CheckForVariableDefined(cmFindBase *this)

{
  cmValue this_00;
  bool bVar1;
  string *psVar2;
  CacheEntryType local_b4;
  allocator<char> local_91;
  string local_90;
  cmValue local_70;
  cmValue *local_68;
  cmValue *hs;
  string *psStack_58;
  CacheEntryType cacheType;
  byte local_49;
  undefined1 auStack_48 [7];
  bool cached;
  char *local_40;
  byte local_31;
  cmValue cStack_30;
  bool found;
  cmValue cacheEntry;
  cmState *state;
  cmValue value;
  cmFindBase *this_local;
  
  value.Value = (string *)this;
  state = (cmState *)
          cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,&this->VariableName);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&state);
  if (bVar1) {
    cacheEntry.Value = (string *)cmMakefile::GetState((this->super_cmFindCommon).Makefile);
    cStack_30 = cmState::GetCacheEntryValue((cmState *)cacheEntry.Value,&this->VariableName);
    psVar2 = cmValue::operator*[abi_cxx11_((cmValue *)&state);
    _auStack_48 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    bVar1 = cmIsNOTFOUND(_auStack_48);
    local_31 = (bVar1 ^ 0xffU) & 1;
    psStack_58 = cStack_30.Value;
    local_49 = ::operator!=(cStack_30,(nullptr_t)0x0);
    if ((bool)local_49) {
      local_b4 = cmState::GetCacheEntryType((cmState *)cacheEntry.Value,&this->VariableName);
    }
    else {
      local_b4 = UNINITIALIZED;
    }
    this_00.Value = cacheEntry.Value;
    hs._4_4_ = local_b4;
    if (((local_49 & 1) != 0) && (local_b4 != UNINITIALIZED)) {
      this->VariableType = local_b4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"HELPSTRING",&local_91)
      ;
      local_70 = cmState::GetCacheEntryProperty(this_00.Value,&this->VariableName,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      local_68 = &local_70;
      bVar1 = cmValue::operator_cast_to_bool(local_68);
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(local_68);
        std::__cxx11::string::operator=((string *)&this->VariableDocumentation,(string *)psVar2);
      }
    }
    if ((local_31 & 1) != 0) {
      if (((local_49 & 1) != 0) && (hs._4_4_ == UNINITIALIZED)) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmFindBase::CheckForVariableDefined()
{
  if (cmValue value = this->Makefile->GetDefinition(this->VariableName)) {
    cmState* state = this->Makefile->GetState();
    cmValue cacheEntry = state->GetCacheEntryValue(this->VariableName);
    bool found = !cmIsNOTFOUND(*value);
    bool cached = cacheEntry != nullptr;
    auto cacheType = cached ? state->GetCacheEntryType(this->VariableName)
                            : cmStateEnums::UNINITIALIZED;

    if (cached && cacheType != cmStateEnums::UNINITIALIZED) {
      this->VariableType = cacheType;
      if (const auto& hs =
            state->GetCacheEntryProperty(this->VariableName, "HELPSTRING")) {
        this->VariableDocumentation = *hs;
      }
    }

    if (found) {
      // If the user specifies the entry on the command line without a
      // type we should add the type and docstring but keep the
      // original value.  Tell the subclass implementations to do
      // this.
      if (cached && cacheType == cmStateEnums::UNINITIALIZED) {
        this->AlreadyInCacheWithoutMetaInfo = true;
      }
      return true;
    }
  }
  return false;
}